

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3SetHasNullFlag(Vdbe *v,int iCur,int regHasNull)

{
  int addr;
  int addr1;
  int regHasNull_local;
  int iCur_local;
  Vdbe *v_local;
  
  sqlite3VdbeAddOp2(v,0x46,0,regHasNull);
  addr = sqlite3VdbeAddOp1(v,0x24,iCur);
  sqlite3VdbeAddOp3(v,0x5a,iCur,0,regHasNull);
  sqlite3VdbeChangeP5(v,0x80);
  sqlite3VdbeJumpHere(v,addr);
  return;
}

Assistant:

static void sqlite3SetHasNullFlag(Vdbe *v, int iCur, int regHasNull){
  int addr1;
  sqlite3VdbeAddOp2(v, OP_Integer, 0, regHasNull);
  addr1 = sqlite3VdbeAddOp1(v, OP_Rewind, iCur); VdbeCoverage(v);
  sqlite3VdbeAddOp3(v, OP_Column, iCur, 0, regHasNull);
  sqlite3VdbeChangeP5(v, OPFLAG_TYPEOFARG);
  VdbeComment((v, "first_entry_in(%d)", iCur));
  sqlite3VdbeJumpHere(v, addr1);
}